

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O2

int format_octal(int64_t v,char *p,int s)

{
  int iVar1;
  ulong uVar2;
  int len;
  char *pcVar3;
  
  if (v < 0) {
    iVar1 = -1;
    for (; 0 < s; s = s + -1) {
      *p = '0';
      p = p + 1;
    }
  }
  else {
    for (uVar2 = (ulong)(uint)s; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      p[uVar2 - 1] = (byte)v & 7 | 0x30;
      v = (ulong)v >> 3;
    }
    if (v == 0) {
      iVar1 = 0;
    }
    else {
      pcVar3 = p + uVar2;
      iVar1 = -1;
      for (; 0 < s; s = s + -1) {
        *pcVar3 = '7';
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
format_octal(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 3)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_octal_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_octal_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}